

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O0

char * xc_functional_get_name(int number)

{
  size_t sVar1;
  char *__dest;
  int in_EDI;
  char *p;
  int ii;
  int local_10;
  
  local_10 = 0;
  while( true ) {
    if (xc_functional_keys[local_10].number == -1) {
      return (char *)0x0;
    }
    if (xc_functional_keys[local_10].number == in_EDI) break;
    local_10 = local_10 + 1;
  }
  sVar1 = strlen(xc_functional_keys[local_10].name);
  __dest = (char *)malloc(sVar1 + 1);
  strcpy(__dest,xc_functional_keys[local_10].name);
  return __dest;
}

Assistant:

char *xc_functional_get_name(int number)
{
  int ii;
  char *p;

  for(ii=0;;ii++){
    if(xc_functional_keys[ii].number == -1)
      return NULL;
    if(xc_functional_keys[ii].number == number) {
      /* return duplicated: caller has the responsibility to dealloc string.
         Do this the old way since strdup and strndup aren't C standard. */
      p = (char *) libxc_malloc(strlen(xc_functional_keys[ii].name) + 1);
      strcpy(p,xc_functional_keys[ii].name);
      return p;
    }
  }
}